

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_uuid_t val)

{
  string *this;
  string local_f8 [32];
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  __cxx11 local_98 [32];
  uint8_t *local_78;
  uint8_t *entry;
  uint8_t *__end1;
  uint8_t *__begin1;
  uint8_t (*__range1) [16];
  string tmp;
  undefined8 local_20;
  ze_device_uuid_t val_local;
  string *str;
  
  local_20 = val.id._8_8_;
  this = val.id._0_8_;
  val_local.id._8_8_ = this;
  std::__cxx11::string::string(this);
  std::__cxx11::string::operator+=(this,"device_uuid_t::id : ");
  std::__cxx11::string::string((string *)&__range1);
  entry = val_local.id + 8;
  __end1 = (uint8_t *)&local_20;
  __begin1 = __end1;
  for (; __end1 != entry; __end1 = __end1 + 1) {
    local_78 = __end1;
    std::__cxx11::to_string(local_98,(uint)*__end1);
    std::__cxx11::string::operator+=((string *)&__range1,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::operator+=((string *)&__range1,", ");
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_f8,(ulong)&__range1);
  std::operator+((char *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[ ");
  std::operator+(local_b8,(char *)local_d8);
  std::__cxx11::string::operator+=(this,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::operator+=(this,"\n");
  return this;
}

Assistant:

std::string to_string( const ze_device_uuid_t val )
{
    std::string str;
    
    str += "device_uuid_t::id : ";
    {
        std::string tmp;
        for( auto& entry : val.id )
        {
            tmp += std::to_string( entry );
            tmp += ", ";
        }
        str += "[ " + tmp.substr( 0, tmp.size() - 2 ) + " ]";;
    }
    str += "\n";

    return str;
}